

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O1

void read_delta_q_params(AV1_COMMON *cm,MACROBLOCKD *xd,aom_reader *r)

{
  od_ec_dec *dec;
  aom_cdf_prob *icdf;
  uint8_t uVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  MB_MODE_INFO *mbmi;
  FRAME_CONTEXT *pFVar5;
  short sVar6;
  int8_t iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  byte bVar11;
  int literal;
  uint uVar12;
  aom_cdf_prob (*cdf) [5];
  uint uVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  
  if ((cm->delta_q_info).delta_q_present_flag == 0) {
    return;
  }
  mbmi = *xd->mi;
  bVar16 = (cm->seq_params->mib_size - 1U & (xd->mi_row | xd->mi_col)) == 0;
  pFVar5 = xd->tile_ctx;
  if (mbmi->bsize == cm->seq_params->sb_size) {
    if (mbmi->skip_txfm == '\0' && bVar16) {
LAB_00a03549:
      icdf = pFVar5->delta_q_cdf;
      dec = &r->ec;
      iVar8 = od_ec_decode_cdf_q15(dec,icdf,4);
      if (r->allow_update_cdf != '\0') {
        uVar3 = pFVar5->delta_q_cdf[4];
        bVar11 = (char)(uVar3 >> 4) + 5;
        lVar15 = 0;
        do {
          uVar4 = icdf[lVar15];
          if (lVar15 < (char)iVar8) {
            sVar6 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar11 & 0x1f));
          }
          else {
            sVar6 = -(uVar4 >> (bVar11 & 0x1f));
          }
          icdf[lVar15] = sVar6 + uVar4;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        pFVar5->delta_q_cdf[4] = pFVar5->delta_q_cdf[4] + (ushort)(uVar3 < 0x20);
      }
      if (2 < iVar8) {
        uVar12 = 0;
        uVar13 = 4;
        do {
          iVar8 = od_ec_decode_bool_q15(dec,0x4000);
          uVar12 = uVar12 | iVar8 << ((char)uVar13 - 2U & 0x1f);
          uVar13 = uVar13 - 1;
        } while (1 < uVar13);
        uVar14 = 0;
        uVar13 = uVar12;
        if (-1 < (int)uVar12) {
          do {
            iVar8 = od_ec_decode_bool_q15(dec,0x4000);
            uVar14 = uVar14 | iVar8 << ((byte)uVar13 & 0x1f);
            iVar8 = uVar13 + 1;
            uVar13 = uVar13 - 1;
          } while (1 < iVar8);
        }
        iVar8 = (1 << ((char)uVar12 + 1U & 0x1f)) + 1 + uVar14;
      }
      if (iVar8 == 0) {
        bVar16 = false;
      }
      else {
        iVar10 = od_ec_decode_bool_q15(dec,0x4000);
        bVar16 = iVar10 == 0;
      }
      iVar10 = -iVar8;
      if (bVar16) {
        iVar10 = iVar8;
      }
      goto LAB_00a0366d;
    }
  }
  else if (bVar16) goto LAB_00a03549;
  iVar10 = 0;
LAB_00a0366d:
  iVar8 = iVar10 * (cm->delta_q_info).delta_q_res + xd->current_base_qindex;
  if (0xfe < iVar8) {
    iVar8 = 0xff;
  }
  iVar10 = 1;
  if (1 < iVar8) {
    iVar10 = iVar8;
  }
  xd->current_base_qindex = iVar10;
  if ((cm->delta_q_info).delta_lf_present_flag != 0) {
    iVar8 = xd->mi_row;
    iVar10 = xd->mi_col;
    if ((cm->delta_q_info).delta_lf_multi == 0) {
      cVar2 = xd->delta_lf_from_base;
      iVar8 = read_delta_lflevel(cm,r,xd->tile_ctx->delta_lf_cdf,mbmi,iVar10,iVar8);
      iVar10 = iVar8 * (cm->delta_q_info).delta_lf_res + (int)cVar2;
      iVar8 = 0x3f;
      if (iVar10 < 0x3f) {
        iVar8 = iVar10;
      }
      iVar7 = -0x3f;
      if (-0x3f < iVar8) {
        iVar7 = (int8_t)iVar8;
      }
      xd->delta_lf_from_base = iVar7;
      mbmi->delta_lf_from_base = iVar7;
    }
    else {
      uVar1 = cm->seq_params->monochrome;
      cdf = xd->tile_ctx->delta_lf_multi_cdf;
      lVar15 = 0;
      do {
        cVar2 = xd->delta_lf[lVar15];
        iVar9 = read_delta_lflevel(cm,r,*cdf,mbmi,iVar10,iVar8);
        iVar9 = iVar9 * (cm->delta_q_info).delta_lf_res + (int)cVar2;
        if (0x3e < iVar9) {
          iVar9 = 0x3f;
        }
        if (iVar9 < -0x3e) {
          iVar9 = -0x3f;
        }
        xd->delta_lf[lVar15] = (int8_t)iVar9;
        mbmi->delta_lf[lVar15] = (int8_t)iVar9;
        lVar15 = lVar15 + 1;
        cdf = cdf + 1;
      } while ((ulong)(uVar1 == '\0') * 2 + 2 != lVar15);
    }
  }
  return;
}

Assistant:

static void read_delta_q_params(AV1_COMMON *const cm, MACROBLOCKD *const xd,
                                aom_reader *r) {
  DeltaQInfo *const delta_q_info = &cm->delta_q_info;

  if (delta_q_info->delta_q_present_flag) {
    MB_MODE_INFO *const mbmi = xd->mi[0];
    xd->current_base_qindex +=
        read_delta_qindex(cm, xd, r, mbmi) * delta_q_info->delta_q_res;
    /* Normative: Clamp to [1,MAXQ] to not interfere with lossless mode */
    xd->current_base_qindex = clamp(xd->current_base_qindex, 1, MAXQ);
    FRAME_CONTEXT *const ec_ctx = xd->tile_ctx;
    if (delta_q_info->delta_lf_present_flag) {
      const int mi_row = xd->mi_row;
      const int mi_col = xd->mi_col;
      if (delta_q_info->delta_lf_multi) {
        const int frame_lf_count =
            av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
        for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id) {
          const int tmp_lvl =
              xd->delta_lf[lf_id] +
              read_delta_lflevel(cm, r, ec_ctx->delta_lf_multi_cdf[lf_id], mbmi,
                                 mi_col, mi_row) *
                  delta_q_info->delta_lf_res;
          mbmi->delta_lf[lf_id] = xd->delta_lf[lf_id] =
              clamp(tmp_lvl, -MAX_LOOP_FILTER, MAX_LOOP_FILTER);
        }
      } else {
        const int tmp_lvl = xd->delta_lf_from_base +
                            read_delta_lflevel(cm, r, ec_ctx->delta_lf_cdf,
                                               mbmi, mi_col, mi_row) *
                                delta_q_info->delta_lf_res;
        mbmi->delta_lf_from_base = xd->delta_lf_from_base =
            clamp(tmp_lvl, -MAX_LOOP_FILTER, MAX_LOOP_FILTER);
      }
    }
  }
}